

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O0

int __thiscall OutputBuffer::write2fd(OutputBuffer *this,int fd)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  int local_18;
  int already_write;
  int fd_local;
  OutputBuffer *this_local;
  
  bVar3 = false;
  if ((this->super_BufferBase).data_buf != (Chunk *)0x0) {
    bVar3 = ((this->super_BufferBase).data_buf)->head == 0;
  }
  if (bVar3) {
    do {
      sVar1 = write(fd,((this->super_BufferBase).data_buf)->data,
                    (long)((this->super_BufferBase).data_buf)->length);
      local_18 = (int)sVar1;
      bVar3 = false;
      if (local_18 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (0 < local_18) {
      Chunk::pop((this->super_BufferBase).data_buf,local_18);
      Chunk::adjust((this->super_BufferBase).data_buf);
    }
    if ((local_18 == -1) && (piVar2 = __errno_location(), *piVar2 == 0xb)) {
      local_18 = 0;
    }
    return local_18;
  }
  __assert_fail("data_buf != nullptr && data_buf->head == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                ,0x87,"int OutputBuffer::write2fd(int)");
}

Assistant:

int OutputBuffer::write2fd(int fd)
{
    assert(data_buf != nullptr && data_buf->head == 0);

    int already_write = 0;

    do { 
        already_write = write(fd, data_buf->data, data_buf->length);
    } while (already_write == -1 && errno == EINTR);

    if (already_write > 0) {
        data_buf->pop(already_write);
        data_buf->adjust();
    }

    if (already_write == -1 && errno == EAGAIN) {
        already_write = 0;
    }

    return already_write;
}